

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

int x509v3_a2i_ipadd(uint8_t *ipout,char *ipasc)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong __n;
  long lVar6;
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined8 local_2c;
  int local_24;
  
  pcVar5 = strchr(ipasc,0x3a);
  if (pcVar5 == (char *)0x0) {
    iVar4 = ipv4_from_asc(ipout,ipasc);
    iVar4 = iVar4 << 2;
  }
  else {
    local_2c = -0x100000000;
    local_24 = 0;
    iVar4 = 0;
    iVar3 = CONF_parse_list(ipasc,0x3a,0,ipv6_cb,&local_3c);
    if (iVar3 != 0) {
      uVar1 = (uint)local_2c;
      uVar2 = local_2c._4_4_;
      __n = (ulong)local_2c._4_4_;
      if (__n == 0xffffffff) {
        if ((uint)local_2c != 0x10) {
          return 0;
        }
      }
      else {
        if (0xf < (int)(uint)local_2c) {
          return 0;
        }
        if (3 < local_24) {
          return 0;
        }
        if (local_24 == 2) {
          if (local_2c._4_4_ != (uint)local_2c && __n != 0) {
            return 0;
          }
        }
        else if (local_24 == 3) {
          if (0 < (int)(uint)local_2c) {
            return 0;
          }
        }
        else if (local_2c._4_4_ == (uint)local_2c || __n == 0) {
          return 0;
        }
      }
      if (local_2c < 0) {
        *(undefined8 *)ipout = local_3c;
        *(undefined8 *)(ipout + 8) = uStack_34;
        iVar4 = 0x10;
      }
      else {
        if (__n != 0) {
          memcpy(ipout,&local_3c,__n);
        }
        lVar6 = (long)(int)(uint)local_2c;
        if (lVar6 != 0x10) {
          memset(ipout,0,0x10 - lVar6);
        }
        iVar4 = 0x10;
        if (uVar1 != uVar2) {
          memcpy(ipout + (0x10 - lVar6),&local_3c,(long)(int)(uVar1 - uVar2));
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int x509v3_a2i_ipadd(uint8_t ipout[16], const char *ipasc) {
  // If string contains a ':' assume IPv6

  if (strchr(ipasc, ':')) {
    if (!ipv6_from_asc(ipout, ipasc)) {
      return 0;
    }
    return 16;
  } else {
    if (!ipv4_from_asc(ipout, ipasc)) {
      return 0;
    }
    return 4;
  }
}